

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void __thiscall
duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>::
Combine<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::hugeint_t>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
          (ArgMinMaxBase<duckdb::GreaterThan,false> *this,
          ArgMinMaxState<duckdb::string_t,_duckdb::hugeint_t> *source,
          ArgMinMaxState<duckdb::string_t,_duckdb::hugeint_t> *target,AggregateInputData *param_3)

{
  ArgMinMaxBase<duckdb::GreaterThan,false> AVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int64_t iVar6;
  undefined7 uVar7;
  string_t new_value;
  
  if (*this == (ArgMinMaxBase<duckdb::GreaterThan,false>)0x1) {
    if ((source->super_ArgMinMaxStateBase).is_initialized == true) {
      uVar2 = *(ulong *)(this + 0x18);
      lVar3 = *(long *)(this + 0x20);
      lVar4 = (source->value).upper;
      uVar5 = (source->value).lower;
      uVar7 = (undefined7)(uVar2 >> 8);
      param_3 = (AggregateInputData *)CONCAT71(uVar7,uVar5 < uVar2);
      if ((lVar3 <= lVar4) &&
         (param_3 = (AggregateInputData *)CONCAT71(uVar7,uVar5 < uVar2 && lVar3 == lVar4),
         uVar2 <= uVar5 || lVar3 != lVar4)) {
        return;
      }
    }
    AVar1 = this[1];
    (source->super_ArgMinMaxStateBase).arg_null = (bool)AVar1;
    if (AVar1 == (ArgMinMaxBase<duckdb::GreaterThan,false>)0x0) {
      new_value.value.pointer.ptr = (char *)param_3;
      new_value.value._0_8_ = *(undefined8 *)(this + 0x10);
      ArgMinMaxStateBase::AssignValue<duckdb::string_t>
                ((ArgMinMaxStateBase *)&source->arg,*(string_t **)(this + 8),new_value);
    }
    iVar6 = *(int64_t *)(this + 0x20);
    (source->value).lower = *(uint64_t *)(this + 0x18);
    (source->value).upper = iVar6;
    (source->super_ArgMinMaxStateBase).is_initialized = true;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_initialized) {
			return;
		}
		if (!target.is_initialized || COMPARATOR::Operation(source.value, target.value)) {
			Assign(target, source.arg, source.value, source.arg_null);
			target.is_initialized = true;
		}
	}